

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O0

void mjs::(anonymous_namespace)::
     for_each_helper<mjs::(anonymous_namespace)::array_for_each(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__0,mjs::(anonymous_namespace)::array_for_each(mjs::gc_heap_ptr<mjs::global_object>const&,mjs::value_const&,std::vector<mjs::value,std::allocator<mjs::value>>const&)::__1>
               (gc_heap_ptr<mjs::global_object> *global,value *this_,
               vector<mjs::value,_std::allocator<mjs::value>_> *args,anon_class_1_0_00000001 *init,
               anon_class_1_0_00000001 *iter)

{
  uint32_t *this;
  allocator<mjs::value> *this_00;
  initializer_list<mjs::value> __l;
  initializer_list<mjs::value> __l_00;
  bool bVar1;
  wchar_t wVar2;
  uint32_t uVar3;
  global_object *pgVar4;
  object *poVar5;
  global_object *pgVar6;
  size_type sVar7;
  reference this_01;
  undefined8 extraout_RDX;
  undefined8 uVar8;
  undefined8 extraout_RDX_00;
  wstring_view wVar9;
  value *local_490;
  value *local_408;
  value *local_3e0;
  value *local_3c8;
  allocator<mjs::value> local_391;
  value *local_390;
  value local_388;
  value local_360;
  value local_338;
  iterator local_310;
  undefined1 local_308 [32];
  undefined1 local_2e8 [8];
  value res_1;
  undefined1 local_2b0 [8];
  value kval_1;
  uint32_t k_1;
  string *n;
  iterator __end3;
  iterator __begin3;
  vector<mjs::string,_std::allocator<mjs::string>_> *__range3;
  vector<mjs::string,_std::allocator<mjs::string>_> pn;
  value local_228;
  value local_200;
  value local_1d8;
  iterator local_1b0;
  undefined1 local_1a8 [32];
  undefined1 local_188 [8];
  value res;
  undefined1 local_150 [8];
  value kval;
  undefined1 local_118 [8];
  wstring is;
  undefined1 local_f0 [4];
  uint32_t k;
  value this_arg;
  undefined1 local_b8 [8];
  value callback;
  value local_70;
  wchar_t local_44;
  undefined1 local_40 [4];
  uint32_t len;
  object_ptr o;
  anon_class_1_0_00000001 *iter_local;
  anon_class_1_0_00000001 *init_local;
  vector<mjs::value,_std::allocator<mjs::value>_> *args_local;
  value *this__local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  o.super_gc_heap_ptr_untyped._8_8_ = iter;
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar4->super_object)._vptr_object[0x11])((gc_heap_ptr<mjs::object> *)local_40,pgVar4,this_);
  poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
  this = &callback.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
          super_gc_heap_ptr_untyped.pos_;
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)this,L"length");
  (**poVar5->_vptr_object)(&local_70,poVar5,this);
  wVar2 = to_uint32(&local_70);
  value::~value(&local_70);
  local_44 = wVar2;
  bVar1 = std::vector<mjs::value,_std::allocator<mjs::value>_>::empty(args);
  if (bVar1) {
    local_3c8 = (value *)value::undefined;
  }
  else {
    local_3c8 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,0);
  }
  value::value((value *)local_b8,local_3c8);
  pgVar4 = gc_heap_ptr<mjs::global_object>::operator->(global);
  pgVar6 = gc_heap_ptr<mjs::global_object>::operator->(global);
  (*(pgVar6->super_object)._vptr_object[0xc])((undefined1 *)((long)&this_arg.field_1 + 0x18));
  global_object::validate_type
            (pgVar4,(value *)local_b8,
             (object_ptr *)
             &this_arg.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_,"function");
  gc_heap_ptr<mjs::object>::~gc_heap_ptr
            ((gc_heap_ptr<mjs::object> *)
             &this_arg.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
              super_gc_heap_ptr_untyped.pos_);
  sVar7 = std::vector<mjs::value,_std::allocator<mjs::value>_>::size(args);
  if (sVar7 < 2) {
    local_3e0 = (value *)value::undefined;
  }
  else {
    local_3e0 = std::vector<mjs::value,_std::allocator<mjs::value>_>::operator[](args,1);
  }
  value::value((value *)local_f0,local_3e0);
  anon_unknown_63::array_for_each::anon_class_1_0_00000001::operator()(init,local_44);
  if ((uint)local_44 < 0x10000) {
    uVar8 = extraout_RDX;
    for (is.field_2._M_local_buf[3] = L'\0'; (uint)is.field_2._M_local_buf[3] < (uint)local_44;
        is.field_2._M_local_buf[3] = is.field_2._M_local_buf[3] + L'\x01') {
      index_string_abi_cxx11_
                ((wstring *)local_118,(mjs *)(ulong)(uint)is.field_2._M_local_buf[3],(uint32_t)uVar8
                );
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
      kval.field_1._24_8_ =
           std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_118);
      bVar1 = object::has_property
                        (poVar5,(wstring_view *)
                                &kval.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                                 super_gc_heap_ptr_untyped.pos_);
      if (bVar1) {
        poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
        res.field_1._24_8_ =
             std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)local_118);
        (**poVar5->_vptr_object)(local_150,poVar5,(undefined1 *)((long)&res.field_1 + 0x18));
        value::value(&local_228,(value *)local_150);
        value::value(&local_200,(double)(uint)is.field_2._M_local_buf[3]);
        value::value(&local_1d8,(object_ptr *)local_40);
        local_1b0 = &local_228;
        local_1a8._0_8_ = 1.48219693752374e-323;
        this_00 = (allocator<mjs::value> *)
                  ((long)&pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 7);
        std::allocator<mjs::value>::allocator(this_00);
        __l_00._M_len = local_1a8._0_8_;
        __l_00._M_array = local_1b0;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_1a8 + 8),__l_00,this_00
                  );
        call_function((value *)local_188,(value *)local_b8,(value *)local_f0,
                      (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_1a8 + 8));
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_1a8 + 8));
        std::allocator<mjs::value>::~allocator
                  ((allocator<mjs::value> *)
                   ((long)&pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 7));
        local_408 = (value *)&local_1b0;
        do {
          local_408 = local_408 + -1;
          value::~value(local_408);
        } while (local_408 != &local_228);
        bVar1 = anon_unknown_63::array_for_each::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)o.super_gc_heap_ptr_untyped._8_8_,
                           is.field_2._M_local_buf[3],(value *)local_188);
        if (bVar1) {
          pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        else {
          pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
        }
        value::~value((value *)local_188);
        value::~value((value *)local_150);
        if ((int)pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage == 0) goto LAB_0016e3b8;
      }
      else {
LAB_0016e3b8:
        pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      }
      std::__cxx11::wstring::~wstring((wstring *)local_118);
      if ((int)pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage != 0) break;
      uVar8 = extraout_RDX_00;
    }
  }
  else {
    poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
    object::enumerable_property_names
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range3,poVar5);
    __end3 = std::vector<mjs::string,_std::allocator<mjs::string>_>::begin
                       ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range3);
    n = (string *)
        std::vector<mjs::string,_std::allocator<mjs::string>_>::end
                  ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                                       *)&n), bVar1) {
      this_01 = __gnu_cxx::
                __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>
                ::operator*(&__end3);
      wVar9 = string::view(this_01);
      kval_1.field_1._24_8_ = wVar9._M_len;
      uVar3 = index_value_from_string
                        ((wstring_view *)
                         &kval_1.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                          super_gc_heap_ptr_untyped.pos_);
      if (uVar3 != 0xffffffff) {
        poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)local_40);
        wVar9 = string::view(this_01);
        res_1.field_1._24_8_ = wVar9._M_len;
        (**poVar5->_vptr_object)(local_2b0,poVar5,(undefined1 *)((long)&res_1.field_1 + 0x18));
        local_390 = &local_388;
        value::value(local_390,(value *)local_2b0);
        local_390 = &local_360;
        value::value(local_390,(double)uVar3);
        local_390 = &local_338;
        value::value(local_390,(object_ptr *)local_40);
        local_310 = &local_388;
        local_308._0_8_ = 1.48219693752374e-323;
        std::allocator<mjs::value>::allocator(&local_391);
        __l._M_len = local_308._0_8_;
        __l._M_array = local_310;
        std::vector<mjs::value,_std::allocator<mjs::value>_>::vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_308 + 8),__l,&local_391
                  );
        call_function((value *)local_2e8,(value *)local_b8,(value *)local_f0,
                      (vector<mjs::value,_std::allocator<mjs::value>_> *)(local_308 + 8));
        std::vector<mjs::value,_std::allocator<mjs::value>_>::~vector
                  ((vector<mjs::value,_std::allocator<mjs::value>_> *)(local_308 + 8));
        std::allocator<mjs::value>::~allocator(&local_391);
        local_490 = (value *)&local_310;
        do {
          local_490 = local_490 + -1;
          value::~value(local_490);
        } while (local_490 != &local_388);
        bVar1 = anon_unknown_63::array_for_each::anon_class_1_0_00000001::operator()
                          ((anon_class_1_0_00000001 *)o.super_gc_heap_ptr_untyped._8_8_,uVar3,
                           (value *)local_2e8);
        if (bVar1) {
          pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        }
        else {
          pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._0_4_ = 5;
        }
        value::~value((value *)local_2e8);
        value::~value((value *)local_2b0);
        if ((int)pn.super__Vector_base<mjs::string,_std::allocator<mjs::string>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage != 0) break;
      }
      __gnu_cxx::
      __normal_iterator<mjs::string_*,_std::vector<mjs::string,_std::allocator<mjs::string>_>_>::
      operator++(&__end3);
    }
    std::vector<mjs::string,_std::allocator<mjs::string>_>::~vector
              ((vector<mjs::string,_std::allocator<mjs::string>_> *)&__range3);
  }
  value::~value((value *)local_f0);
  value::~value((value *)local_b8);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_40);
  return;
}

Assistant:

void for_each_helper(gc_heap_ptr<global_object> global, const value& this_, const std::vector<value>& args, const Init& init, const Iter& iter) {
    auto o = global->to_object(this_);
    const auto len = to_uint32(o->get(L"length"));
    const auto callback = !args.empty() ? args[0] : value::undefined;
    global->validate_type(callback, global->function_prototype(), "function");
    const auto this_arg = args.size() > 1 ? args[1] : value::undefined;

    init(len);
    if (len < array_object::max_normal_size) {
        for (uint32_t k = 0; k < len; ++k) {
            const auto is = index_string(static_cast<uint32_t>(k));
            if (o->has_property(is)) {
                auto kval = o->get(is);
                auto res = call_function(callback, this_arg, { kval, value{static_cast<double>(k)}, value{o} });
                if (!iter(k, res)) {
                    break;
                }
            }
        }
    } else {
        // For large/sparse array, don't run the loop a billion times...
        // This is a large win for the es5 conformance suite, but might not
        // be appropriate otherwise.
        auto pn = o->enumerable_property_names();
        for (const auto& n : pn) {
            const auto k = index_value_from_string(n.view());
            if (k == invalid_index_value) {
                continue;
            }
            auto kval = o->get(n.view());
            auto res = call_function(callback, this_arg, { kval, value{static_cast<double>(k)}, value{o} });
            if (!iter(k, res)) {
                break;
            }
        }
    }
}